

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPathCommand.cxx
# Opt level: O0

string * __thiscall
cmFindPathCommand::FindHeader_abi_cxx11_(string *__return_storage_ptr__,cmFindPathCommand *this)

{
  ulong uVar1;
  string local_90;
  string local_70;
  string local_40;
  undefined1 local_19;
  cmFindPathCommand *local_18;
  cmFindPathCommand *this_local;
  string *header;
  
  local_19 = 0;
  local_18 = this;
  this_local = (cmFindPathCommand *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  if ((((this->super_cmFindBase).super_cmFindCommon.SearchFrameworkFirst & 1U) != 0) ||
     (((this->super_cmFindBase).super_cmFindCommon.SearchFrameworkOnly & 1U) != 0)) {
    FindFrameworkHeader_abi_cxx11_(&local_40,this);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_40);
    std::__cxx11::string::~string((string *)&local_40);
  }
  uVar1 = std::__cxx11::string::empty();
  if (((uVar1 & 1) != 0) &&
     (((this->super_cmFindBase).super_cmFindCommon.SearchFrameworkOnly & 1U) == 0)) {
    FindNormalHeader_abi_cxx11_(&local_70,this);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_70);
    std::__cxx11::string::~string((string *)&local_70);
  }
  uVar1 = std::__cxx11::string::empty();
  if (((uVar1 & 1) != 0) &&
     (((this->super_cmFindBase).super_cmFindCommon.SearchFrameworkLast & 1U) != 0)) {
    FindFrameworkHeader_abi_cxx11_(&local_90,this);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_90);
    std::__cxx11::string::~string((string *)&local_90);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmFindPathCommand::FindHeader()
{
  std::string header;
  if(this->SearchFrameworkFirst || this->SearchFrameworkOnly)
    {
    header = this->FindFrameworkHeader();
    }
  if(header.empty() && !this->SearchFrameworkOnly)
    {
    header = this->FindNormalHeader();
    }
  if(header.empty() && this->SearchFrameworkLast)
    {
    header = this->FindFrameworkHeader();
    }
  return header;
}